

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O0

int main(void)

{
  int iVar1;
  CMUnitTest tests [14];
  undefined1 auStackY_238 [128];
  CMFixtureFunction in_stack_fffffffffffffe48;
  CMFixtureFunction in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  CMUnitTest *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  
  memcpy(auStackY_238,&PTR_anon_var_dwarf_5c_00181ba0,0x230);
  iVar1 = _cmocka_run_group_tests
                    (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                     in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  return iVar1;
}

Assistant:

int main() {
    const struct CMUnitTest tests[] = {
        cmocka_unit_test(test_set_to_val),
        cmocka_unit_test(test_construct),
        cmocka_unit_test(test_union_intersection),
        cmocka_unit_test(test_iterate),
        cmocka_unit_test(test_iterate2),
        cmocka_unit_test(test_next_bits_iterate),
        cmocka_unit_test(test_max_min),
        cmocka_unit_test(test_counts),
        cmocka_unit_test(test_shift_right),
        cmocka_unit_test(test_shift_left),
        cmocka_unit_test(test_disjoint),
        cmocka_unit_test(test_intersects),
        cmocka_unit_test(test_contains_all),
        cmocka_unit_test(test_contains_all_different_sizes),
    };

    return cmocka_run_group_tests(tests, NULL, NULL);
}